

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O3

err_t ReadData(ebml_master *Element,stream *Input,ebml_parser_context *ParserContext,
              bool_t AllowDummyElt,int Scope,size_t DepthCheckCRC)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  stream *psVar4;
  size_t sVar5;
  filepos_t fVar6;
  long lVar7;
  ebml_crc *Element_00;
  bool_t bVar8;
  filepos_t fVar9;
  long lVar10;
  ebml_context *Context_00;
  stream *psVar11;
  ebml_crc *peVar12;
  int iVar13;
  bool bVar14;
  int UpperEltFound;
  uint8_t *CRCData;
  filepos_t OffSet;
  ebml_parser_context Context;
  int local_ac;
  stream *local_a8;
  int local_9c;
  char *local_98;
  stream *local_90;
  size_t local_88;
  ebml_crc *local_80;
  array local_78;
  long local_68;
  size_t local_60;
  long local_58;
  ebml_parser_context local_50;
  
  local_ac = 0;
  local_98 = (char *)0x0;
  local_9c = Scope;
  local_60 = DepthCheckCRC;
  NodeTree_Clear((nodetree *)Element);
  (Element->Base).bValueIsSet = '\0';
  if (((Element->Base).DataSize < 1) &&
     (bVar8 = EBML_ElementIsFiniteSize(&Element->Base), bVar8 != 0)) {
    (Element->Base).bValueIsSet = '\x01';
    if (0 < local_ac) {
LAB_00117d99:
      __assert_fail("SubElement!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x1a0,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
  }
  else {
    if (Input == (stream *)0x0) {
      __assert_fail("(const void*)(Input)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x123,
                    "err_t ReadData(ebml_master *, struct stream *, const ebml_parser_context *, bool_t, int, size_t)"
                   );
    }
    pcVar2 = *(code **)((long)(Input->Base).VMT + 0x78);
    fVar6 = EBML_ElementPositionData(&Element->Base);
    lVar7 = (*pcVar2)(Input,fVar6,0);
    if (lVar7 == -1) {
      return -9;
    }
    lVar7 = (Element->Base).DataSize;
    local_50.Context = (Element->Base).Context;
    local_50.UpContext = ParserContext;
    local_50.EndPosition = EBML_ElementPositionEnd(&Element->Base);
    local_50.Profile = ParserContext->Profile;
    local_90 = Input;
    Element_00 = (ebml_crc *)EBML_FindNextElement(Input,&local_50,&local_ac,AllowDummyElt);
    local_80 = (ebml_crc *)0x0;
    if ((Element_00 != (ebml_crc *)0x0) && (local_ac < 1)) {
      local_88 = 0;
      local_58 = local_60 - 1;
      if (local_60 == 0) {
        local_58 = 0;
      }
      bVar3 = true;
      local_a8 = local_90;
      local_80 = (ebml_crc *)0x0;
      iVar13 = local_9c;
      do {
        bVar8 = EBML_ElementIsFiniteSize(&Element->Base);
        if (bVar8 != 0) {
          fVar6 = EBML_ElementPositionEnd(&Element_00->Base);
          fVar9 = EBML_ElementPositionEnd(&Element->Base);
          iVar13 = local_9c;
          if (fVar9 < fVar6) goto LAB_00117ce0;
        }
        if ((AllowDummyElt == 0) && (bVar8 = EBML_ElementIsDummy(&Element_00->Base), bVar8 != 0)) {
          EBML_ElementSkipData(&Element_00->Base,local_a8,&local_50,(ebml_element *)0x0,0);
LAB_00117a7a:
          NodeDelete((node *)Element_00);
          Element_00 = (ebml_crc *)0x0;
        }
        else {
          lVar10 = (**(code **)((long)(Element_00->Base).Base.Base.VMT + 0x78))
                             (Element_00,local_a8,&local_50,AllowDummyElt,iVar13,local_58);
          peVar12 = local_80;
          if (lVar10 != 0) goto LAB_00117a7a;
          if (((iVar13 == 2) || (local_60 == 0)) || (!bVar3)) {
LAB_00117a92:
            if (peVar12 != Element_00) {
              EBML_MasterAppend(Element,&Element_00->Base);
            }
          }
          else {
            Context_00 = EBML_getContextEbmlCrc32();
            bVar8 = EBML_ElementIsType(&Element_00->Base,Context_00);
            bVar3 = true;
            if ((bVar8 == 0) || (peVar12 != (ebml_crc *)0x0)) goto LAB_00117a92;
            bVar8 = EBML_ElementIsFiniteSize(&Element->Base);
            psVar11 = local_90;
            if (bVar8 == 0) {
              peVar12 = (ebml_crc *)0x0;
LAB_00117a90:
              bVar3 = false;
              goto LAB_00117a92;
            }
            bVar8 = Node_IsPartOf(local_90,0x534d454d);
            peVar12 = Element_00;
            if (bVar8 == 0) {
              local_78._Begin = (char *)0x0;
              local_78._Used = 0;
              fVar6 = EBML_ElementPositionEnd(&Element->Base);
              fVar9 = EBML_ElementPositionEnd(&Element_00->Base);
              if (fVar6 - fVar9 == 0xffffffffffffffff) goto LAB_00117a4d;
              bVar8 = ArrayResize(&local_78,fVar6 - fVar9,0);
              sVar5 = local_78._Used;
              bVar3 = false;
              if (bVar8 != 0) {
                local_98 = local_78._Begin;
                psVar11 = (stream *)NodeCreate(Element,0x534d454d);
                local_88 = sVar5;
                if (psVar11 != (stream *)0x0) {
                  local_68 = EBML_ElementPositionEnd(&Element_00->Base);
                  (**(code **)((long)(psVar11->Base).VMT + 0x20))(psVar11,0x100,local_98,sVar5);
                  (**(code **)((long)(psVar11->Base).VMT + 0x20))(psVar11,0x102,&local_68);
                  psVar4 = local_90;
                  pcVar2 = *(code **)((long)(local_90->Base).VMT + 0x78);
                  local_a8 = psVar11;
                  fVar6 = EBML_ElementPositionEnd(&Element_00->Base);
                  (*pcVar2)(psVar4,fVar6,0);
                  lVar7 = (**(code **)((long)(psVar4->Base).VMT + 0x58))(psVar4,local_98,sVar5);
                  iVar13 = local_9c;
                  if (lVar7 != 0) {
                    StreamClose(local_a8);
                    ArrayClear(&local_78);
                    local_98 = (char *)0x0;
                    local_a8 = psVar4;
                    peVar12 = (ebml_crc *)0x0;
                    iVar13 = local_9c;
                  }
                  goto LAB_00117a90;
                }
                ArrayClear(&local_78);
                local_a8 = local_90;
                goto LAB_00117a4d;
              }
            }
            else {
              pcVar2 = *(code **)((long)(psVar11->Base).VMT + 0x78);
              fVar6 = EBML_ElementPositionEnd(&Element_00->Base);
              lVar7 = (*pcVar2)(psVar11,fVar6,0);
              (**(code **)((long)(psVar11->Base).VMT + 0x18))(psVar11,0x102,&local_68,8);
              (**(code **)((long)(psVar11->Base).VMT + 0x18))(psVar11,0x101,&local_98);
              iVar13 = local_9c;
              local_98 = local_98 + (lVar7 - local_68);
              fVar6 = EBML_ElementDataSize(&Element->Base,1);
              fVar9 = EBML_ElementFullSize(&Element_00->Base,1);
              local_88 = fVar6 - fVar9;
              (**(code **)((long)(psVar11->Base).VMT + 0x58))(psVar11,local_98,local_88);
LAB_00117a4d:
              bVar3 = false;
            }
          }
          local_80 = peVar12;
          EBML_ElementSkipData
                    (&Element_00->Base,local_a8,&local_50,(ebml_element *)0x0,AllowDummyElt);
          fVar6 = EBML_ElementPositionEnd(&Element->Base);
          fVar9 = EBML_ElementPositionEnd(&Element_00->Base);
          lVar7 = fVar6 - fVar9;
        }
        if (local_ac < 1) {
          if (((local_ac < 0) && (local_ac = local_ac + 1, local_ac != 0)) ||
             ((bVar8 = EBML_ElementIsFiniteSize(&Element->Base), bVar8 != 0 && (lVar7 < 1))))
          goto LAB_00117ce0;
          Element_00 = (ebml_crc *)EBML_FindNextElement(local_a8,&local_50,&local_ac,AllowDummyElt);
        }
        else {
          iVar1 = local_ac + -1;
          bVar14 = local_ac != 1;
          local_ac = iVar1;
          if ((bVar14) ||
             ((bVar8 = EBML_ElementIsFiniteSize(&Element->Base), bVar8 != 0 && (lVar7 < 1))))
          goto LAB_00117ce0;
        }
        if ((Element_00 == (ebml_crc *)0x0) || (0 < local_ac)) goto LAB_00117ce0;
      } while( true );
    }
    local_a8 = local_90;
    local_88 = 0;
LAB_00117ce0:
    peVar12 = local_80;
    if (local_98 != (char *)0x0) {
      bVar8 = EBML_CRCMatches(local_80,local_98,local_88);
      Element->CheckSumStatus = 2 - (uint)(bVar8 == 0);
      NodeDelete((node *)peVar12);
      if (local_98 == local_78._Begin) {
        StreamClose(local_a8);
        ArrayClear(&local_78);
      }
    }
    (Element->Base).bValueIsSet = '\x01';
    if (0 < local_ac) {
      if (Element_00 != (ebml_crc *)0x0) {
        (**(code **)((long)(local_90->Base).VMT + 0x78))
                  (local_90,(Element_00->Base).ElementPosition,0);
        NodeDelete((node *)Element_00);
        return 0;
      }
      goto LAB_00117d99;
    }
  }
  return 0;
}

Assistant:

static err_t ReadData(ebml_master *Element, struct stream *Input, const ebml_parser_context *ParserContext, bool_t AllowDummyElt, int Scope, size_t DepthCheckCRC)
{
    int UpperEltFound = 0;
    bool_t bFirst = 1;
    ebml_element *SubElement = NULL;
    ebml_crc *CRCElement = NULL;
    struct stream *ReadStream = Input;
    array CrcBuffer;
    uint8_t *CRCData = NULL;
    size_t CRCDataSize = 0;

    // remove all existing elements, including the mandatory ones...
    NodeTree_Clear((nodetree*)Element);
    Element->Base.bValueIsSet = 0;

	// read blocks and discard the ones we don't care about
	if (Element->Base.DataSize > 0 || !EBML_ElementIsFiniteSize((ebml_element*)Element)) {
        ebml_parser_context Context;
        filepos_t MaxSizeToRead;

        if (Stream_Seek(Input,EBML_ElementPositionData((ebml_element*)Element),SEEK_SET)==INVALID_FILEPOS_T)
            return ERR_END_OF_FILE;

        MaxSizeToRead = Element->Base.DataSize;
        Context.UpContext = ParserContext;
        Context.Context = Element->Base.Context;
        Context.EndPosition = EBML_ElementPositionEnd((ebml_element*)Element);
        Context.Profile = ParserContext->Profile;
        SubElement = EBML_FindNextElement(Input,&Context,&UpperEltFound,AllowDummyElt);
		while (SubElement && UpperEltFound<=0 && (!EBML_ElementIsFiniteSize((ebml_element*)Element) || EBML_ElementPositionEnd(SubElement) <= EBML_ElementPositionEnd((ebml_element*)Element)))
        {
			if (!AllowDummyElt && EBML_ElementIsDummy(SubElement)) {
                // TODO: this should never happen
                EBML_ElementSkipData(SubElement,ReadStream,&Context,NULL,AllowDummyElt);
				NodeDelete((node*)SubElement); // forget this unknown element
                SubElement = NULL;
			}
            else
            {
                if (EBML_ElementReadData(SubElement,ReadStream,&Context,AllowDummyElt, Scope, DepthCheckCRC?DepthCheckCRC-1:0)==ERR_NONE)
                {
                    if (bFirst && DepthCheckCRC && Scope!=SCOPE_NO_DATA && EBML_ElementIsType(SubElement, EBML_getContextEbmlCrc32()) && CRCElement==NULL)
                    {
                        if (EBML_ElementIsFiniteSize((ebml_element*)Element))
                        {
                            CRCElement = (ebml_crc*)SubElement;
                            if (Node_IsPartOf(Input, MEMSTREAM_CLASS))
                            {
                                filepos_t DataPos = Stream_Seek(Input,EBML_ElementPositionEnd(SubElement),SEEK_SET);
                                filepos_t OffSet;
                                Node_GET(Input,MEMSTREAM_OFFSET,&OffSet);
                                Node_GET(Input,MEMSTREAM_PTR,&CRCData);
                                CRCData += (DataPos - OffSet);
                                CRCDataSize = (size_t)(EBML_ElementDataSize((ebml_element*)Element,1) - EBML_ElementFullSize(SubElement,1));
                                Stream_Read(Input, CRCData, CRCDataSize, NULL);
                            }
                            else
                            {
                                // read the rest of the element in memory to avoid reading it a second time later
                                ArrayInit(&CrcBuffer);
                                filepos_t element_size = EBML_ElementPositionEnd((ebml_element*)Element) - EBML_ElementPositionEnd(SubElement);
#if MAX_FILEPOS >= SIZE_MAX
                                if ((filepos_t)element_size < (filepos_t)SIZE_MAX
#else
                                if ((size_t)element_size < (size_t)SIZE_MAX
#endif
                                    && ArrayResize(&CrcBuffer, (size_t)element_size, 0))
                                {
                                    CRCData = ARRAYBEGIN(CrcBuffer,uint8_t);
                                    CRCDataSize = ARRAYCOUNT(CrcBuffer,uint8_t);
                                    ReadStream = (struct stream*)NodeCreate(Element, MEMSTREAM_CLASS);
                                    if (ReadStream==NULL)
                                    {
                                        ReadStream=Input; // revert back to normal reading
                                        ArrayClear(&CrcBuffer);
                                    }
                                    else
                                    {
                                        filepos_t Offset = EBML_ElementPositionEnd(SubElement);
                                        Node_Set(ReadStream, MEMSTREAM_DATA, CRCData, CRCDataSize);
                                        Node_SET(ReadStream, MEMSTREAM_OFFSET, &Offset);
                                        Stream_Seek(Input,EBML_ElementPositionEnd(SubElement),SEEK_SET);
                                        if (Stream_Read(Input, CRCData, CRCDataSize, NULL)!=ERR_NONE)
                                        {
                                            StreamClose(ReadStream);
                                            ReadStream=Input; // revert back to normal reading
                                            ArrayClear(&CrcBuffer);
                                            CRCData = NULL;
                                            CRCElement = NULL;
                                        }
                                    }
                                }
                            }
                        }
                        bFirst = 0;
                    }
                    if (CRCElement != (ebml_crc*)SubElement)
                        EBML_MasterAppend(Element,SubElement);
			        // just in case
                    EBML_ElementSkipData(SubElement,ReadStream,&Context,NULL,AllowDummyElt);
                }
                else
                {
                    NodeDelete((node*)SubElement);
                    SubElement = NULL;
                }
			}
            if (SubElement)
			    MaxSizeToRead = EBML_ElementPositionEnd((ebml_element*)Element) - EBML_ElementPositionEnd(SubElement); // even if it's the default value

			if (UpperEltFound > 0) {
				UpperEltFound--;
				if (UpperEltFound > 0 || (EBML_ElementIsFiniteSize((ebml_element*)Element) && MaxSizeToRead <= 0))
					goto processCrc;
				continue;
			}

			if (UpperEltFound < 0) {
				UpperEltFound++;
				if (UpperEltFound < 0)
					goto processCrc;
			}

			if (EBML_ElementIsFiniteSize((ebml_element*)Element) && MaxSizeToRead <= 0) {
				goto processCrc;// this level is finished
			}

			SubElement = EBML_FindNextElement(ReadStream,&Context,&UpperEltFound,AllowDummyElt);
		}
	}
processCrc:
    if (CRCData!=NULL)
    {
        Element->CheckSumStatus = EBML_CRCMatches(CRCElement, CRCData, CRCDataSize)?2:1;
        NodeDelete((node*)CRCElement);
        if (CRCData == ARRAYBEGIN(CrcBuffer,uint8_t))
        {
            StreamClose(ReadStream);
            ArrayClear(&CrcBuffer);
        }
    }

    Element->Base.bValueIsSet = 1;
    if (UpperEltFound>0) // move back to the upper element beginning so that the next loop can find it
    {
        assert(SubElement!=NULL);
        Stream_Seek(Input,SubElement->ElementPosition,SEEK_SET);
        NodeDelete((node*)SubElement); // forget about it, it will be read again later
    }
    return ERR_NONE;
}